

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O0

bool ctemplate::Template::StringToTemplateCache(TemplateString *key,TemplateString *content)

{
  bool bVar1;
  undefined4 local_20;
  undefined1 local_19;
  int i;
  bool retval;
  TemplateString *content_local;
  TemplateString *key_local;
  
  local_19 = true;
  for (local_20 = DO_NOT_STRIP; (int)local_20 < 3; local_20 = local_20 + STRIP_BLANK_LINES) {
    bVar1 = ctemplate::StringToTemplateCache(key,content,local_20);
    if (!bVar1) {
      local_19 = false;
    }
  }
  return local_19;
}

Assistant:

bool Template::StringToTemplateCache(const TemplateString& key,
                                     const TemplateString& content) {
  // We say the insert succeeded only if it succeded for all strip values.
  bool retval = true;
  for (int i = 0; i < static_cast<int>(NUM_STRIPS); ++i) {
    if (!GOOGLE_NAMESPACE::StringToTemplateCache(key, content, static_cast<Strip>(i)))
      retval = false;
  }
  return retval;
}